

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
          (xpath_ast_node *this,xml_node_struct *ns,long *xn,undefined8 param_4,byte once)

{
  bool bVar1;
  xml_node_struct *in_RAX;
  xml_node xVar2;
  xpath_allocator *alloc;
  xml_node local_38;
  
  local_38._root = in_RAX;
  if (xn[1] == 0) {
    xVar2._root = (xml_node_struct *)*xn;
  }
  else {
    xml_node::xml_node(&local_38);
    xVar2._root = local_38._root;
  }
  if (xVar2._root == (xml_node_struct *)0x0) {
    alloc = (xpath_allocator *)*xn;
    if ((alloc != (xpath_allocator *)0x0 && (xml_node_struct *)xn[1] != (xml_node_struct *)0x0) &&
       ((this->_test != '\x02' ||
        (bVar1 = step_push((xpath_ast_node *)0x2,(xpath_node_set_raw *)(this->_data).variable,
                           (xml_attribute_struct *)ns,(xml_node_struct *)xn[1],alloc),
        (bVar1 & once) == 0)))) {
      do {
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,alloc);
        if ((bVar1 & once) != 0) {
          return;
        }
        alloc = (xpath_allocator *)alloc[1]._root;
      } while (alloc != (xpath_allocator *)0x0);
    }
  }
  else {
    if (xn[1] == 0) {
      local_38._root = (xml_node_struct *)*xn;
    }
    else {
      xml_node::xml_node(&local_38);
    }
    do {
      bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                        (xpath_node_set_raw *)(this->_data).variable,ns,
                        (xpath_allocator *)local_38._root);
      if ((bVar1 & once) != 0) {
        return;
      }
      local_38._root = (local_38._root)->parent;
    } while (local_38._root != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}